

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_ref_t art_iterator_neighbor_child(art_iterator_t *iterator,_Bool forward)

{
  art_ref_t ref;
  art_node_t *node_00;
  byte in_SIL;
  long in_RDI;
  art_indexed_child_t indexed_child;
  art_node_t *node;
  art_iterator_frame_t frame;
  undefined8 in_stack_ffffffffffffff98;
  art_node_t *in_stack_ffffffffffffffa0;
  art_indexed_child_t in_stack_ffffffffffffffa8;
  art_indexed_child_t in_stack_ffffffffffffffb8;
  undefined8 local_38;
  
  ref = *(art_ref_t *)(in_RDI + 0x20 + (ulong)*(byte *)(in_RDI + 0x19) * 0x10);
  node_00 = art_deref(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8.child);
  if ((in_SIL & 1) == 0) {
    art_ref_typecode(ref);
    in_stack_ffffffffffffffa8 =
         art_node_prev_child(in_stack_ffffffffffffffa0,(art_typecode_t)((ulong)node_00 >> 0x38),
                             (int)node_00);
    local_38 = in_stack_ffffffffffffffa8.child;
  }
  else {
    art_ref_typecode(ref);
    in_stack_ffffffffffffffb8 =
         art_node_next_child(node_00,(art_typecode_t)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                             (int)in_stack_ffffffffffffff98);
    local_38 = in_stack_ffffffffffffffb8.child;
  }
  if (local_38 != 0) {
    art_iterator_down(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8.child,
                      in_stack_ffffffffffffffa8._15_1_);
  }
  return local_38;
}

Assistant:

static art_ref_t art_iterator_neighbor_child(art_iterator_t *iterator,
                                             bool forward) {
    art_iterator_frame_t frame = iterator->frames[iterator->frame];
    art_node_t *node = art_deref(iterator->art, frame.ref);
    art_indexed_child_t indexed_child;
    if (forward) {
        indexed_child = art_node_next_child(node, art_ref_typecode(frame.ref),
                                            frame.index_in_node);
    } else {
        indexed_child = art_node_prev_child(node, art_ref_typecode(frame.ref),
                                            frame.index_in_node);
    }
    if (indexed_child.child != CROARING_ART_NULL_REF) {
        art_iterator_down(iterator, frame.ref, indexed_child.index);
    }
    return indexed_child.child;
}